

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> __thiscall
capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *this,Client *client)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  capnp::_::CapabilityServerSetBase::getLocalServerInternal
            ((CapabilityServerSetBase *)&local_18,(Client *)client);
  kj::Promise<void*>::
  then<capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer(capnproto_test::capnp::test::TestInterface::Client&)::_lambda(void*)_1_>
            ((Promise<void*> *)this,(anon_class_1_0_00000001_for_func *)&local_18);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<typename T::Server&>> CapabilityServerSet<T>::getLocalServer(
    typename T::Client& client) {
  return getLocalServerInternal(client)
      .then([](void* server) -> kj::Maybe<typename T::Server&> {
    if (server == nullptr) {
      return kj::none;
    } else {
      return *reinterpret_cast<typename T::Server*>(server);
    }
  });
}